

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_filter_zstd.c
# Opt level: O1

int zstd_bidder_bid(archive_read_filter_bidder *self,archive_read_filter *filter)

{
  int iVar1;
  uchar *p;
  uint *puVar2;
  ssize_t avail;
  ssize_t sStack_8;
  
  puVar2 = (uint *)__archive_read_filter_ahead(filter,4,&sStack_8);
  if (puVar2 == (uint *)0x0) {
    iVar1 = 0;
  }
  else {
    iVar1 = 0x20;
    if (*puVar2 != 0xfd2fb528) {
      iVar1 = (uint)((*puVar2 & 0xfffffff0) == 0x184d2a50) << 5;
    }
  }
  return iVar1;
}

Assistant:

static int
zstd_bidder_bid(struct archive_read_filter_bidder *self,
    struct archive_read_filter *filter)
{
	const unsigned char *buffer;
	ssize_t avail;
	unsigned prefix;

	/* Zstd frame magic values */
	const unsigned zstd_magic = 0xFD2FB528U;
	const unsigned zstd_magic_skippable_start = 0x184D2A50U;
	const unsigned zstd_magic_skippable_mask = 0xFFFFFFF0;

	(void) self; /* UNUSED */

	buffer = __archive_read_filter_ahead(filter, 4, &avail);
	if (buffer == NULL)
		return (0);

	prefix = archive_le32dec(buffer);
	if (prefix == zstd_magic)
		return (32);
	if ((prefix & zstd_magic_skippable_mask) == zstd_magic_skippable_start)
		return (32);

	return (0);
}